

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O0

bool __thiscall Assimp::Q3BSPFileParser::parseFile(Q3BSPFileParser *this)

{
  bool bVar1;
  Q3BSPFileParser *this_local;
  
  bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->m_Data);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = validateFormat(this);
    if (bVar1) {
      getLumps(this);
      countLumps(this);
      getVertices(this);
      getIndices(this);
      getFaces(this);
      getTextures(this);
      getLightMaps(this);
      getEntities(this);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Q3BSPFileParser::parseFile() {
    if ( m_Data.empty() ) {
        return false;
    }

    if ( !validateFormat() )
    {
        return false;
    }

    // Imports the dictionary of the level
    getLumps();

    // Count data and prepare model data
    countLumps();

    // Read in Vertices
    getVertices();

    // Read in Indices
    getIndices();

    // Read Faces
    getFaces();

    // Read Textures
    getTextures();

    // Read Lightmaps
    getLightMaps();

    // Load the entities
    getEntities();

    return true;
}